

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::Path> * __thiscall
tinyusdz::MetaVariable::get_value<tinyusdz::Path>
          (optional<tinyusdz::Path> *__return_storage_ptr__,MetaVariable *this)

{
  Path *value;
  
  value = tinyusdz::value::Value::as<tinyusdz::Path>(&this->_value,false);
  if (value == (Path *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    memset(&__return_storage_ptr__->contained,0,0xd0);
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::Path>::optional<const_tinyusdz::Path_&,_0>
              (__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }